

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkMemAbstractTest(Wlc_Ntk_t *p)

{
  uint uVar1;
  Vec_Int_t *vMemObjs_00;
  Vec_Wec_t *p_00;
  Vec_Int_t *vNodeFrames;
  Vec_Int_t *p_01;
  Wlc_Ntk_t *pWVar2;
  Vec_Int_t *vMemFanins;
  Vec_Int_t *vMemObjs;
  int iFirstMemCi;
  int iFirstCi;
  int iFirstMemPi;
  
  vMemObjs_00 = Wlc_NtkCollectMemory(p,0);
  pWVar2 = p;
  vMemObjs = vMemObjs_00;
  vMemFanins = Wlc_NtkCollectMemFanins(p,vMemObjs_00);
  p_00 = Vec_WecAlloc((int)pWVar2);
  vNodeFrames = Vec_IntAlloc(100);
  p_01 = Vec_WecPushLevel(p_00);
  Vec_IntPush(p_01,0x5800);
  Vec_IntPush(p_01,0x5000);
  Vec_IntPush(p_01,0x4000);
  Vec_IntPush(p_01,0x4800);
  Wlc_NtkAbsAddToNodeFrames(vNodeFrames,p_01);
  pWVar2 = Wlc_NtkAbstractMemory
                     (p,vMemObjs_00,(Vec_Int_t *)0x0,&iFirstMemPi,&iFirstCi,&iFirstMemCi,p_00,
                      vNodeFrames);
  Vec_WecFree(p_00);
  Vec_IntFree(vNodeFrames);
  uVar1 = Wlc_CountDcs(pWVar2->pInits);
  printf("iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n",
         (ulong)(uint)iFirstMemPi,(ulong)(uint)iFirstCi,(ulong)(uint)iFirstMemCi,(ulong)uVar1);
  Vec_IntFreeP(&vMemObjs);
  Vec_IntFreeP(&vMemFanins);
  return pWVar2;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemAbstractTest( Wlc_Ntk_t * p )
{
    int iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits;
    Vec_Int_t * vRefine;
    Vec_Int_t * vMemObjs    = Wlc_NtkCollectMemory( p, 0 );
    Vec_Int_t * vMemFanins  = Wlc_NtkCollectMemFanins( p, vMemObjs );

    Vec_Wec_t * vRefines    = Vec_WecAlloc( 100 );
    Vec_Int_t * vNodeFrames = Vec_IntAlloc( 100 );
    Wlc_Ntk_t * pNewFull;

    vRefine     = Vec_WecPushLevel(vRefines);
    Vec_IntPush( vRefine,  (11 << 11) | 0 );
    Vec_IntPush( vRefine,  (10 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 8 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 9 << 11) | 0 );
    Wlc_NtkAbsAddToNodeFrames( vNodeFrames, vRefine );

//    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, vMemFanins, &iFirstMemPi, &iFirstCi, &iFirstMemCi, NULL, NULL );
    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, NULL, &iFirstMemPi, &iFirstCi, &iFirstMemCi, vRefines, vNodeFrames );

    Vec_WecFree( vRefines );
    Vec_IntFree( vNodeFrames );

    nDcBits     = Wlc_CountDcs( pNewFull->pInits );
    printf( "iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n", iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits );

    Vec_IntFreeP( &vMemObjs );
    Vec_IntFreeP( &vMemFanins );
    return pNewFull;
}